

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O1

S2ShapeIndexRegion<S2ShapeIndex> * __thiscall
S2ShapeIndexRegion<S2ShapeIndex>::Clone(S2ShapeIndexRegion<S2ShapeIndex> *this)

{
  S2ShapeIndex *pSVar1;
  S2ShapeIndexRegion<S2ShapeIndex> *pSVar2;
  Iterator *pIVar3;
  
  pSVar2 = (S2ShapeIndexRegion<S2ShapeIndex> *)operator_new(0x28);
  pSVar1 = (this->contains_query_).index_;
  (pSVar2->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2ShapeIndexRegion_002c2828;
  (pSVar2->contains_query_).index_ = pSVar1;
  (pSVar2->contains_query_).options_.vertex_model_ = SEMI_OPEN;
  pIVar3 = &(pSVar2->contains_query_).it_;
  (*pSVar1->_vptr_S2ShapeIndex[6])(pIVar3,pSVar1,2);
  pSVar2->iter_ = pIVar3;
  return pSVar2;
}

Assistant:

S2ShapeIndexRegion<IndexType>* S2ShapeIndexRegion<IndexType>::Clone() const {
  return new S2ShapeIndexRegion<IndexType>(&index());
}